

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O1

ExpressionValue *
expLabelFuncDefined(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                   vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>
                   *parameters)

{
  ExpressionValueType EVar1;
  anon_union_8_2_b358304e_for_ExpressionValue_1 aVar2;
  Identifier *args;
  
  args = (Identifier *)
         (parameters->
         super__Vector_base<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>).
         _M_impl.super__Vector_impl_data._M_start;
  if ((args == (Identifier *)
               (parameters->
               super__Vector_base<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>)
               ._M_impl.super__Vector_impl_data._M_finish) ||
     (args = (Identifier *)(args->_name)._M_dataplus._M_p, args == (Identifier *)0x0)) {
    Logger::queueError<Identifier>((Logger *)0x1,0x189646,(char *)funcName,args);
    EVar1 = Invalid;
    aVar2.intValue = 0;
  }
  else {
    aVar2.intValue._1_7_ = 0;
    aVar2.intValue._0_1_ = args[2]._name.field_2._M_local_buf[1];
    EVar1 = Integer;
  }
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = EVar1;
  __return_storage_ptr__->field_1 = aVar2;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expLabelFuncDefined(const Identifier &funcName, const std::vector<std::shared_ptr<Label>> &parameters)
{
	if (parameters.empty() || !parameters.front())
	{
		Logger::queueError(Logger::Error, "%s: Invalid parameters", funcName);
		return ExpressionValue();
	}

	return ExpressionValue(parameters.front()->isDefined() ? INT64_C(1) : INT64_C(0));
}